

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vepu541_common.c
# Opt level: O3

MPP_RET copy2osd2(MppEncOSDData2 *dst,MppEncOSDData *src1,MppEncOSDData2 *src2)

{
  undefined8 *puVar1;
  uint uVar2;
  MppBuffer pvVar3;
  undefined8 uVar4;
  RK_U32 *pRVar5;
  long lVar6;
  
  if (src1 == (MppEncOSDData *)0x0) {
    if (src2 == (MppEncOSDData2 *)0x0) {
      return MPP_NOK;
    }
    memcpy(dst,src2,0x148);
  }
  else {
    uVar2 = src1->num_region;
    dst->num_region = uVar2;
    if ((ulong)uVar2 != 0) {
      pvVar3 = src1->buf;
      pRVar5 = &src1->region[0].buf_offset;
      lVar6 = 0;
      do {
        uVar4 = *(undefined8 *)(pRVar5 + -4);
        puVar1 = (undefined8 *)((long)&dst->region[0].enable + lVar6);
        *puVar1 = *(undefined8 *)(pRVar5 + -6);
        puVar1[1] = uVar4;
        *(undefined8 *)((long)&dst->region[0].num_mb_x + lVar6) = *(undefined8 *)(pRVar5 + -2);
        *(RK_U32 *)((long)&dst->region[0].buf_offset + lVar6) = *pRVar5;
        *(MppBuffer *)((long)&dst->region[0].buf + lVar6) = pvVar3;
        pRVar5 = pRVar5 + 7;
        lVar6 = lVar6 + 0x28;
      } while ((ulong)uVar2 * 0x28 != lVar6);
      return MPP_OK;
    }
  }
  return MPP_OK;
}

Assistant:

static MPP_RET copy2osd2(MppEncOSDData2* dst, MppEncOSDData *src1, MppEncOSDData2 *src2)
{
    MPP_RET ret = MPP_OK;
    RK_U32 i = 0;

    if (src1) {
        dst->num_region = src1->num_region;
        for (i = 0; i < src1->num_region; i++) {
            dst->region[i].enable       = src1->region[i].enable;
            dst->region[i].inverse      = src1->region[i].inverse;
            dst->region[i].start_mb_x   = src1->region[i].start_mb_x;
            dst->region[i].start_mb_y   = src1->region[i].start_mb_y;
            dst->region[i].num_mb_x     = src1->region[i].num_mb_x;
            dst->region[i].num_mb_y     = src1->region[i].num_mb_y;
            dst->region[i].buf_offset   = src1->region[i].buf_offset;
            dst->region[i].buf          = src1->buf;
        }
        ret = MPP_OK;
    } else if (src2) {
        memcpy(dst, src2, sizeof(MppEncOSDData2));
        ret = MPP_OK;
    } else {
        ret = MPP_NOK;
    }
    return ret;
}